

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cc
# Opt level: O2

bool __thiscall
flow::lang::CallableSym::tryMatch(CallableSym *this,ParamList *params,string *errorMessage)

{
  LiteralType LVar1;
  NativeCallback *this_00;
  pointer pLVar2;
  pointer pLVar3;
  pointer puVar4;
  pointer pbVar5;
  bool bVar6;
  LiteralType LVar7;
  undefined4 uVar8;
  Signature *pSVar9;
  string *psVar10;
  DefaultValue *pDVar11;
  iterator __end4;
  Signature *in_R8;
  Signature *in_R9;
  size_t sVar12;
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *arg;
  pointer pcVar13;
  pointer puVar14;
  iterator __begin4;
  pointer pbVar15;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  string_view format_str_04;
  string_view format_str_05;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  superfluous;
  string t;
  vector<flow::LiteralType,_std::allocator<flow::LiteralType>_> local_68;
  string local_50;
  
  this_00 = this->nativeCallback_;
  if ((params->values_).
      super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (params->values_).
      super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if (this_00 == (NativeCallback *)0x0) {
      return true;
    }
    pSVar9 = NativeCallback::signature(this_00);
    if ((pSVar9->args_).super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (pSVar9->args_).super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      return true;
    }
  }
  if (params->isNamed_ == true) {
    if ((this_00->names_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this_00->names_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pSVar9 = signature(this);
      pLVar2 = (pSVar9->args_).
               super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pLVar3 = (pSVar9->args_).
               super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar12 = 0;
      do {
        if (((ulong)((long)pLVar2 - (long)pLVar3) >> 2 & 0xffffffff) == sVar12) {
          superfluous.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          superfluous.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          superfluous.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ParamList::reorder(params,this_00,&superfluous);
          pbVar5 = superfluous.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          bVar6 = superfluous.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  superfluous.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
          if (!bVar6) {
            t._M_dataplus._M_p = (pointer)&t.field_2;
            t._M_string_length = 0;
            t.field_2._M_local_buf[0] = '\0';
            for (pbVar15 = superfluous.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar15 != pbVar5;
                pbVar15 = pbVar15 + 1) {
              if (t._M_string_length != 0) {
                std::__cxx11::string::append((char *)&t);
              }
              std::__cxx11::string::append((char *)&t);
              std::__cxx11::string::append((string *)&t);
              std::__cxx11::string::append((char *)&t);
            }
            format_str_01.size_ = (size_t)&(this->super_Symbol).name_;
            format_str_01.data_ = (char *)0x30;
            fmt::v5::format<std::__cxx11::string,std::__cxx11::string>
                      (&local_50,(v5 *)"Superfluous arguments passed to callee \"{}\": {}.",
                       format_str_01,&t,&in_R9->name_);
            std::__cxx11::string::operator=((string *)errorMessage,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&t);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&superfluous);
          return bVar6;
        }
        psVar10 = NativeCallback::getParamNameAt_abi_cxx11_(this_00,sVar12);
        bVar6 = ParamList::contains(params,psVar10);
        if (!bVar6) {
          pDVar11 = NativeCallback::getDefaultParamAt_abi_cxx11_(this_00,sVar12);
          if ((pDVar11->
              super__Variant_base<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
              ).
              super__Move_assign_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
              .
              super__Copy_assign_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
              .
              super__Move_ctor_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
              .
              super__Copy_ctor_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
              .
              super__Variant_storage_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
              ._M_index == '\0') {
            format_str_03.size_ = &(this->super_Symbol).name_;
            format_str_03.data_ = (char *)0x3a;
            fmt::v5::format<std::__cxx11::string,std::__cxx11::string>
                      (&t,(v5 *)"Callee \"{}\" invoked without required named parameter \"{}\".",
                       format_str_03,psVar10,&in_R9->name_);
            std::__cxx11::string::operator=((string *)errorMessage,(string *)&t);
            goto LAB_0012e6ef;
          }
          pSVar9 = signature(this);
          completeDefaultValue
                    (params,(pSVar9->args_).
                            super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>
                            ._M_impl.super__Vector_impl_data._M_start[sVar12],pDVar11,psVar10);
        }
        sVar12 = sVar12 + 1;
      } while( true );
    }
    format_str_00.size_ = (size_t)&(this->super_Symbol).name_;
    format_str_00.data_ = (char *)0x4c;
    fmt::v5::format<std::__cxx11::string>
              (&t,(v5 *)
                  "Callee \"{}\" invoked with named parameters, but no names provided by runtime.",
               format_str_00,&in_R8->name_);
  }
  else {
    puVar14 = (params->values_).
              super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    puVar4 = (params->values_).
             super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar9 = signature(this);
    if ((ulong)((long)puVar14 - (long)puVar4 >> 3) <=
        (ulong)((long)(pSVar9->args_).
                      super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(pSVar9->args_).
                      super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2)) {
      puVar14 = (params->values_).
                super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      puVar4 = (params->values_).
               super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (pcVar13 = (pointer)0x1; (long)pcVar13 - ((long)puVar14 - (long)puVar4 >> 3) != 1;
          pcVar13 = pcVar13 + 1) {
        pSVar9 = signature(this);
        LVar1 = (pSVar9->args_).
                super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>._M_impl.
                super__Vector_impl_data._M_start[(long)(pcVar13 + -1)];
        LVar7 = (**(code **)(*(long *)(params->values_).
                                      super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start
                                      [(long)(pcVar13 + -1)]._M_t.
                                      super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                                      ._M_t + 0x18))();
        if (LVar7 != LVar1) {
          local_50._M_dataplus._M_p = pcVar13;
          pSVar9 = signature(this);
          format_str_02.size_ = (size_t)&local_50;
          format_str_02.data_ = (char *)0x34;
          fmt::v5::format<unsigned_long,flow::Signature>
                    (&t,(v5 *)"Type mismatch in positional parameter {}, callee {}.",format_str_02,
                     (unsigned_long *)pSVar9,in_R9);
          goto LAB_0012e6e4;
        }
      }
      sVar12 = (long)(params->values_).
                     super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(params->values_).
                     super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3;
      pSVar9 = signature(this);
      pLVar2 = (pSVar9->args_).
               super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pLVar3 = (pSVar9->args_).
               super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>._M_impl.
               super__Vector_impl_data._M_start;
      while( true ) {
        if ((long)pLVar2 - (long)pLVar3 >> 2 == sVar12) {
          Signature::Signature((Signature *)&t);
          std::__cxx11::string::_M_assign((string *)&t);
          signature(this);
          superfluous.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          superfluous.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          superfluous.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          puVar4 = (params->values_).
                   super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (puVar14 = (params->values_).
                         super__Vector_base<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>,_std::allocator<std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; puVar14 != puVar4;
              puVar14 = puVar14 + 1) {
            uVar8 = (**(code **)((long)(((puVar14->_M_t).
                                         super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>
                                         .super__Head_base<0UL,_flow::lang::Expr_*,_false>.
                                        _M_head_impl)->super_ASTNode)._vptr_ASTNode + 0x18))();
            local_50._M_dataplus._M_p._0_4_ = uVar8;
            std::vector<flow::LiteralType,_std::allocator<flow::LiteralType>_>::
            emplace_back<flow::LiteralType>
                      ((vector<flow::LiteralType,_std::allocator<flow::LiteralType>_> *)&superfluous
                       ,(LiteralType *)&local_50);
          }
          std::vector<flow::LiteralType,_std::allocator<flow::LiteralType>_>::operator=
                    (&local_68,
                     (vector<flow::LiteralType,_std::allocator<flow::LiteralType>_> *)&superfluous);
          pSVar9 = signature(this);
          bVar6 = Signature::operator!=((Signature *)&t,pSVar9);
          if (bVar6) {
            pSVar9 = signature(this);
            format_str_04.size_ = (size_t)&t;
            format_str_04.data_ = (char *)0x45;
            fmt::v5::format<flow::Signature,flow::Signature>
                      (&local_50,
                       (v5 *)"Callee parameter type signature mismatch: {} passed, but {} expected."
                       ,format_str_04,pSVar9,in_R9);
            std::__cxx11::string::operator=((string *)errorMessage,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
          }
          std::_Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>::~_Vector_base
                    ((_Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_> *)
                     &superfluous);
          Signature::~Signature((Signature *)&t);
          return !bVar6;
        }
        pDVar11 = NativeCallback::getDefaultParamAt_abi_cxx11_(this_00,sVar12);
        if ((pDVar11->
            super__Variant_base<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
            ).
            super__Move_assign_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
            .
            super__Copy_assign_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
            .
            super__Move_ctor_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
            .
            super__Copy_ctor_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
            .
            super__Variant_storage_alias<std::monostate,_bool,_std::__cxx11::basic_string<char>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
            ._M_index == '\0') break;
        psVar10 = NativeCallback::getParamNameAt_abi_cxx11_(this_00,sVar12);
        pSVar9 = NativeCallback::signature(this_00);
        completeDefaultValue
                  (params,(pSVar9->args_).
                          super__Vector_base<flow::LiteralType,_std::allocator<flow::LiteralType>_>.
                          _M_impl.super__Vector_impl_data._M_start[sVar12],pDVar11,psVar10);
        sVar12 = sVar12 + 1;
      }
      local_50._M_dataplus._M_p = (pointer)(sVar12 + 1);
      pSVar9 = signature(this);
      format_str_05.size_ = (size_t)&local_50;
      format_str_05.data_ = (char *)0x41;
      fmt::v5::format<unsigned_long,flow::Signature>
                (&t,(v5 *)"No default value provided for positional parameter {}, callee {}.",
                 format_str_05,(unsigned_long *)pSVar9,in_R9);
LAB_0012e6e4:
      std::__cxx11::string::operator=((string *)errorMessage,(string *)&t);
      goto LAB_0012e6ef;
    }
    pSVar9 = signature(this);
    format_str.size_ = (size_t)pSVar9;
    format_str.data_ = (char *)0x24;
    fmt::v5::format<flow::Signature>
              (&t,(v5 *)"Superfluous parameters to callee {}.",format_str,in_R8);
  }
  std::__cxx11::string::operator=((string *)errorMessage,(string *)&t);
LAB_0012e6ef:
  std::__cxx11::string::~string((string *)&t);
  return false;
}

Assistant:

bool CallableSym::tryMatch(ParamList& params, std::string* errorMessage) const {
  // printf("CallableSym(%s).tryMatch()\n", name().c_str());

  const NativeCallback* native = nativeCallback();

  if (params.empty() && (!native || native->signature().args().empty()))
    return true;

  if (params.isNamed()) {
    if (!native->parametersNamed()) {
      *errorMessage = fmt::format(
          "Callee \"{}\" invoked with named parameters, but no names provided "
          "by runtime.",
          name());
      return false;
    }

    int argc = signature().args().size();
    for (int i = 0; i != argc; ++i) {
      const auto& paramName = native->getParamNameAt(i);
      if (!params.contains(paramName)) {
        const NativeCallback::DefaultValue& defaultValue =
            native->getDefaultParamAt(i);
        if (std::holds_alternative<std::monostate>(defaultValue)) {
          *errorMessage = fmt::format(
              "Callee \"{}\" invoked without required named parameter \"{}\".",
              name(), paramName);
          return false;
        }
        LiteralType type = signature().args()[i];
        completeDefaultValue(params, type, defaultValue, paramName);
      }
    }

    // reorder params (and detect superfluous params)
    std::vector<std::string> superfluous;
    params.reorder(native, &superfluous);

    if (!superfluous.empty()) {
      std::string t;
      for (const auto& s : superfluous) {
        if (!t.empty()) t += ", ";
        t += "\"";
        t += s;
        t += "\"";
      }
      *errorMessage = fmt::format(
          "Superfluous arguments passed to callee \"{}\": {}.", name(), t);
      return false;
    }

    return true;
  } else  // verify params positional
  {
    if (params.size() > signature().args().size()) {
      *errorMessage = fmt::format("Superfluous parameters to callee {}.", signature());
      return false;
    }

    for (size_t i = 0, e = params.size(); i != e; ++i) {
      LiteralType expectedType = signature().args()[i];
      LiteralType givenType = params.values()[i]->getType();
      if (givenType != expectedType) {
        *errorMessage = fmt::format(
            "Type mismatch in positional parameter {}, callee {}.",
            i + 1, signature());
        return false;
      }
    }

    for (size_t i = params.size(), e = signature().args().size(); i != e; ++i) {
      const NativeCallback::DefaultValue& defaultValue = native->getDefaultParamAt(i);
      if (std::holds_alternative<std::monostate>(defaultValue)) {
        *errorMessage = fmt::format(
            "No default value provided for positional parameter {}, callee {}.",
            i + 1, signature());
        return false;
      }

      const std::string& name = native->getParamNameAt(i);
      LiteralType type = native->signature().args()[i];
      completeDefaultValue(params, type, defaultValue, name);
    }

    Signature sig;
    sig.setName(this->name());
    sig.setReturnType(signature().returnType());  // XXX cheetah
    std::vector<LiteralType> argTypes;
    for (const auto& arg : params.values()) {
      argTypes.push_back(arg->getType());
    }
    sig.setArgs(argTypes);

    if (sig != signature()) {
      *errorMessage = fmt::format(
          "Callee parameter type signature mismatch: {} passed, but {} expected.",
          sig, signature());
      return false;
    }

    return true;
  }
}